

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::CaseStatement::ItemGroup>::
emplaceRealloc<slang::ast::CaseStatement::ItemGroup>
          (SmallVectorBase<slang::ast::CaseStatement::ItemGroup> *this,pointer pos,ItemGroup *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  size_type sVar4;
  size_t sVar5;
  undefined8 uVar6;
  pointer pIVar7;
  pointer pIVar8;
  pointer pIVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar11 = this->len + 1;
  uVar3 = this->cap;
  if (uVar11 < uVar3 * 2) {
    uVar11 = uVar3 * 2;
  }
  if (0x555555555555555 - uVar3 < uVar3) {
    uVar11 = 0x555555555555555;
  }
  lVar12 = (long)pos - (long)this->data_;
  pIVar9 = (pointer)operator_new(uVar11 * 0x18);
  *(Statement **)((long)pIVar9 + lVar12 + 0x10) = (args->stmt).ptr;
  sVar5 = (args->expressions)._M_extent._M_extent_value;
  *(undefined8 *)((long)pIVar9 + lVar12) = (args->expressions)._M_ptr;
  ((undefined8 *)((long)pIVar9 + lVar12))[1] = sVar5;
  p = this->data_;
  sVar4 = this->len;
  lVar10 = (long)p + (sVar4 * 0x18 - (long)pos);
  pIVar7 = p;
  pIVar8 = pIVar9;
  if (lVar10 == 0) {
    if (sVar4 != 0) {
      lVar10 = 0;
      do {
        *(undefined8 *)((long)&(pIVar9->stmt).ptr + lVar10) =
             *(undefined8 *)((long)&(p->stmt).ptr + lVar10);
        puVar1 = (undefined8 *)((long)&(p->expressions)._M_ptr + lVar10);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pIVar9->expressions)._M_ptr + lVar10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar10 = lVar10 + 0x18;
      } while (sVar4 * 0x18 != lVar10);
    }
  }
  else {
    for (; pIVar7 != pos; pIVar7 = pIVar7 + 1) {
      (pIVar8->stmt).ptr = (pIVar7->stmt).ptr;
      sVar5 = (pIVar7->expressions)._M_extent._M_extent_value;
      (pIVar8->expressions)._M_ptr = (pIVar7->expressions)._M_ptr;
      (pIVar8->expressions)._M_extent._M_extent_value = sVar5;
      pIVar8 = pIVar8 + 1;
    }
    memcpy((void *)((long)pIVar9 + lVar12 + 0x18),pos,((lVar10 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar11;
  this->data_ = pIVar9;
  return (pointer)((long)pIVar9 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}